

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O2

void quantize_3(float *src,char *dst,int n,int k)

{
  ulong uVar1;
  bool bVar2;
  
  if ((k & 0x3fU) != 0) {
    __assert_fail("k % QK == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                  ,0x357,"void quantize_3(const float *restrict, char *restrict, int, int)");
  }
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    quantize_3_row(src,dst,k);
    dst = dst + (k >> 6) * 0x24;
    src = src + k;
  }
  return;
}

Assistant:

void quantize_3(const float * restrict src, char * restrict dst, int n, int k) {
    assert(k % QK == 0);

    for (int j = 0; j < n; j++) {
        quantize_3_row(src + j*k, dst, k);
        dst = (char *) dst + quantize_3_row_size(k);
    }
}